

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void api_fixed_suite::fixed_push_front_iterator(void)

{
  basic_iterator<int> first_end;
  uint uVar1;
  pointer piVar2;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  vector<int,_std::allocator<int>_> input;
  circular_view<int,_4UL> span;
  int array [4];
  allocator_type local_99;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_78;
  circular_view<int,_4UL> local_60;
  circular_view<int,_4UL> *local_48;
  ulong uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  type local_28 [4];
  
  local_60.member.data = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_60.member.size = 0;
  local_60.member.next = 4;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x160000000b;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_78,__l,(allocator_type *)&local_38);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar2 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      vista::circular_view<int,_4UL>::push_front(&local_60,*piVar2);
      piVar2 = piVar2 + 1;
    } while (piVar2 != local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  local_38 = 0x210000002c;
  uStack_30 = 0xb00000016;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_98,__l_00,&local_99);
  local_48 = &local_60;
  first_begin.current._0_4_ = (uint)local_60.member.next - (int)local_60.member.size & 7;
  uVar1 = (uint)local_60.member.next & 7;
  uStack_40 = (ulong)uVar1;
  first_end.current._0_4_ = uVar1;
  first_end.parent = local_48;
  first_end.current._4_4_ = 0;
  first_begin.parent = local_48;
  first_begin.current._4_4_ = 0;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,4ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x3d1,"void api_fixed_suite::fixed_push_front_iterator()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (value_type *)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void fixed_push_front_iterator()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    std::vector<int> input = { 11, 22, 33, 44 };
    span.push_front(input.begin(), input.end());
    {
        std::vector<int> expect = { 44, 33, 22, 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}